

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O3

void TestHugeAllocations(AllocatorState *rnd)

{
  char cVar1;
  void *pvVar2;
  long lVar3;
  TestingPortal *pTVar4;
  long *plVar5;
  undefined8 uVar6;
  char *pcVar7;
  size_t i;
  ulong uVar8;
  size_t local_30;
  
  uVar8 = 0;
  do {
    local_30 = ~uVar8;
    (*noopt_helper)(&local_30);
    pvVar2 = AllocatorState::alloc(rnd,local_30);
    if (pvVar2 != (void *)0x0) {
      pcVar7 = "Check failed: p == nullptr\n";
      uVar6 = 0x1b;
      goto LAB_0011356e;
    }
    lVar3 = random();
    uVar8 = uVar8 + lVar3 % 0x14;
  } while (uVar8 < 70000);
  pTVar4 = tcmalloc::TestingPortal::Get();
  cVar1 = (**(code **)(*(long *)pTVar4 + 8))(pTVar4);
  if (cVar1 == '\0') {
    uVar8 = 0;
    do {
      pvVar2 = AllocatorState::alloc(rnd,uVar8 + 0x7fffffffffffffff);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
      }
      pvVar2 = AllocatorState::alloc(rnd,uVar8 ^ 0x7fffffffffffffff);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != 100);
  }
  plVar5 = (long *)MallocExtension::instance();
  if (plVar5 != (long *)0x0) {
    (**(code **)(*plVar5 + 0x90))(plVar5);
    return;
  }
  pcVar7 = "Check failed: inst\n";
  uVar6 = 0x13;
LAB_0011356e:
  syscall(1,2,pcVar7,uVar6);
  abort();
}

Assistant:

static void TestHugeAllocations(AllocatorState* rnd) {
  // Check that asking for stuff tiny bit smaller than largest possible
  // size returns nullptr.
  for (size_t i = 0; i < 70000; i += rnd->Uniform(20)) {
    TryHugeAllocation(kMaxSize - i, rnd);
  }
  // Asking for memory sizes near signed/unsigned boundary (kMaxSignedSize)
  // might work or not, depending on the amount of virtual memory.
  if (!TestingPortal::Get()->IsDebuggingMalloc()) {
   // debug allocation takes forever for huge allocs
    for (size_t i = 0; i < 100; i++) {
      void* p = nullptr;
      p = rnd->alloc(kMaxSignedSize + i);
      if (p) free(p);    // if: free(nullptr) is not necessarily defined
      p = rnd->alloc(kMaxSignedSize - i);
      if (p) free(p);
    }
  }

  // Check that ReleaseFreeMemory has no visible effect (aka, does not
  // crash the test):
  MallocExtension* inst = MallocExtension::instance();
  CHECK(inst);
  inst->ReleaseFreeMemory();
}